

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_orderby.cpp
# Opt level: O1

bool __thiscall
duckdb::Transformer::TransformOrderBy
          (Transformer *this,PGList *order,vector<duckdb::OrderByNode,_true> *result)

{
  PGNodeTag PVar1;
  PGNodeTag PVar2;
  NotImplementedException *pNVar3;
  PGListCell *pPVar4;
  OrderByNullType null_order;
  OrderType type;
  optional_ptr<duckdb_libpgquery::PGNode,_true> temp_node;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  order_expression;
  OrderByNullType local_62;
  OrderType local_61;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_60;
  undefined1 local_58 [32];
  PGList *local_38;
  
  local_38 = order;
  if ((order != (PGList *)0x0) && (pPVar4 = order->head, pPVar4 != (PGListCell *)0x0)) {
    do {
      local_60.ptr = (PGNode *)(pPVar4->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid(&local_60);
      if ((local_60.ptr)->type != T_PGSortBy) {
        pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_58._0_8_ = local_58 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"ORDER BY list member type %d\n","");
        optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid(&local_60);
        NotImplementedException::NotImplementedException<duckdb_libpgquery::PGNodeTag>
                  (pNVar3,(string *)local_58,(local_60.ptr)->type);
        __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar1 = local_60.ptr[4].type;
      PVar2 = local_60.ptr[5].type;
      if (PVar1 == T_PGExprContext) {
        local_61 = DESCENDING;
      }
      else if (PVar1 == T_PGIndexInfo) {
        local_61 = ASCENDING;
      }
      else {
        if (PVar1 != T_PGInvalid) {
          pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_58._0_8_ = local_58 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,"Unimplemented order by type","");
          NotImplementedException::NotImplementedException(pNVar3,(string *)local_58);
          __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        local_61 = ORDER_DEFAULT;
      }
      if (PVar2 == T_PGExprContext) {
        local_62 = NULLS_LAST;
      }
      else if (PVar2 == T_PGIndexInfo) {
        local_62 = NULLS_FIRST;
      }
      else {
        if (PVar2 != T_PGInvalid) {
          pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_58._0_8_ = local_58 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,"Unimplemented order by type","");
          NotImplementedException::NotImplementedException(pNVar3,(string *)local_58);
          __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        local_62 = ORDER_DEFAULT;
      }
      TransformExpression((Transformer *)local_58,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
      ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)result,&local_61
                 ,&local_62,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_58);
      if ((Transformer *)local_58._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      pPVar4 = pPVar4->next;
    } while (pPVar4 != (PGListCell *)0x0);
  }
  return local_38 != (PGList *)0x0;
}

Assistant:

bool Transformer::TransformOrderBy(duckdb_libpgquery::PGList *order, vector<OrderByNode> &result) {
	if (!order) {
		return false;
	}

	for (auto node = order->head; node != nullptr; node = node->next) {
		auto temp_node = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
		if (temp_node->type != duckdb_libpgquery::T_PGSortBy) {
			throw NotImplementedException("ORDER BY list member type %d\n", temp_node->type);
		}

		OrderType type;
		OrderByNullType null_order;
		auto sort = PGCast<duckdb_libpgquery::PGSortBy>(*temp_node.get());
		auto target = sort.node;

		if (sort.sortby_dir == duckdb_libpgquery::PG_SORTBY_DEFAULT) {
			type = OrderType::ORDER_DEFAULT;
		} else if (sort.sortby_dir == duckdb_libpgquery::PG_SORTBY_ASC) {
			type = OrderType::ASCENDING;
		} else if (sort.sortby_dir == duckdb_libpgquery::PG_SORTBY_DESC) {
			type = OrderType::DESCENDING;
		} else {
			throw NotImplementedException("Unimplemented order by type");
		}

		if (sort.sortby_nulls == duckdb_libpgquery::PG_SORTBY_NULLS_DEFAULT) {
			null_order = OrderByNullType::ORDER_DEFAULT;
		} else if (sort.sortby_nulls == duckdb_libpgquery::PG_SORTBY_NULLS_FIRST) {
			null_order = OrderByNullType::NULLS_FIRST;
		} else if (sort.sortby_nulls == duckdb_libpgquery::PG_SORTBY_NULLS_LAST) {
			null_order = OrderByNullType::NULLS_LAST;
		} else {
			throw NotImplementedException("Unimplemented order by type");
		}

		auto order_expression = TransformExpression(target);
		result.emplace_back(type, null_order, std::move(order_expression));
	}
	return true;
}